

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_multi_prefix_op
          (Impl *this,SPIRVModule *module,Op opcode,Id type_id)

{
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *pvVar2;
  Set<spv::Capability> *this_00;
  pointer *ppMVar3;
  uint uVar4;
  pointer ppIVar5;
  iterator __position;
  Block *thenBlock;
  Id IVar6;
  Op OVar7;
  pointer pMVar8;
  Function *pFVar9;
  Block *pBVar10;
  Block *pBVar11;
  Instruction *pIVar12;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> tVar13;
  Instruction *pIVar14;
  uint *puVar15;
  char *name;
  iterator iVar16;
  Builder *pBVar17;
  Id IVar18;
  Block *entry;
  Id bool_type;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_138;
  Id local_120;
  Op local_11c;
  Block *local_118;
  Block *local_110;
  Function *local_108;
  Builder *local_100;
  Id local_f8;
  Op local_f4;
  Id local_f0;
  Id local_ec;
  Block *local_e8;
  Block *local_e0;
  Block *local_d8;
  Block *local_d0;
  Id local_c4;
  Block *local_c0;
  Block *local_b8;
  ulong local_b0;
  Vector<std::unique_ptr<Instruction>_> *local_a8;
  Vector<std::unique_ptr<Instruction>_> *local_a0;
  Vector<std::unique_ptr<Instruction>_> *local_98;
  Block *local_90;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_88;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_80;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  Vector<Id> local_50;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  pMVar8 = (this->wave_multi_prefix_call_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pMVar8 == (this->wave_multi_prefix_call_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar17 = &this->builder;
      local_90 = (this->builder).buildPoint;
      local_118 = (Block *)0x0;
      IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,false);
      IVar6 = spv::Builder::makeVectorType(pBVar17,IVar6,4);
      local_ec = spv::Builder::makeBoolType(pBVar17);
      local_c4 = spv::Builder::makeVectorType(pBVar17,local_ec,4);
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 2;
      *local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = type_id;
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[1] = IVar6;
      local_120 = IVar6;
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (this->helper_lanes_participate_in_wave_ops == false) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_50,
                   (iterator)
                   local_50.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_ec);
      }
      if (opcode - OpGroupNonUniformIAdd < 0xd) {
        name = &DAT_001c5510 + *(int *)(&DAT_001c5510 + (ulong)(opcode - OpGroupNonUniformIAdd) * 4)
        ;
      }
      else {
        name = "";
      }
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0 = (ulong)opcode;
      pFVar9 = spv::Builder::makeFunctionEntry
                         (pBVar17,DecorationMax,type_id,name,&local_50,&local_138,&local_118);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::~vector(&local_138);
      ppIVar5 = (pFVar9->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_f8 = (*ppIVar5)->resultId;
      local_11c = ppIVar5[1]->resultId;
      local_f0 = type_id;
      local_f4 = spv::Builder::createUndefined(pBVar17,type_id);
      local_d0 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      local_d0->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
      pVVar1 = &local_d0->instructions;
      (local_d0->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d0->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d0->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d0->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0->parent = pFVar9;
      local_d0->unreachable = false;
      local_108 = pFVar9;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      pFVar9 = local_108;
      ((local_d0->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_d0;
      spv::Module::mapInstruction
                (local_108->parent,
                 (local_d0->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      pBVar10 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      pBVar10->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
      (pBVar10->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar10->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar10->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar10->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar10->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar10->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar10->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar10->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar10->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar10->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar10->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar10->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar10->parent = pFVar9;
      pBVar10->unreachable = false;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      local_98 = &pBVar10->instructions;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&pBVar10->instructions,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      ((pBVar10->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar10;
      spv::Module::mapInstruction
                (pFVar9->parent,
                 (pBVar10->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      local_d8 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      local_d8->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
      pVVar1 = &local_d8->instructions;
      (local_d8->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d8->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d8->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d8->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d8->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d8->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d8->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d8->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d8->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d8->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d8->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d8->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8->parent = pFVar9;
      local_d8->unreachable = false;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      local_a8 = pVVar1;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      ((local_d8->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_d8;
      spv::Module::mapInstruction
                (pFVar9->parent,
                 (local_d8->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      local_e0 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      local_e0->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
      pVVar1 = &local_e0->instructions;
      (local_e0->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e0->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e0->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_e0->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e0->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e0->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_e0->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e0->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e0->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_e0->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e0->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e0->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0->parent = pFVar9;
      local_e0->unreachable = false;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      local_a0 = pVVar1;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      ((local_e0->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_e0;
      spv::Module::mapInstruction
                (pFVar9->parent,
                 (local_e0->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      local_e8 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      local_e8->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
      pVVar1 = &local_e8->instructions;
      (local_e8->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e8->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e8->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_e8->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e8->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e8->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_e8->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e8->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e8->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_e8->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_e8->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_e8->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8->parent = pFVar9;
      local_e8->unreachable = false;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      pFVar9 = local_108;
      ((local_e8->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_e8;
      spv::Module::mapInstruction
                (local_108->parent,
                 (local_e8->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      (this->builder).buildPoint = local_118;
      local_100 = pBVar17;
      if (this->helper_lanes_participate_in_wave_ops == false) {
        local_110 = (Block *)allocate_in_thread(0x78);
        IVar6 = (this->builder).uniqueId + 1;
        (this->builder).uniqueId = IVar6;
        local_110->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
        pVVar1 = &local_110->instructions;
        (local_110->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_110->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_110->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_110->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_110->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_110->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_110->successors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_110->successors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_110->successors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_110->localVariables).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_110->localVariables).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_110->localVariables).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_110->parent = pFVar9;
        local_110->unreachable = false;
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
        *(undefined ***)
         &(local_138.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
        *(Id *)(local_138.
                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
        std::
        vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
        ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                  ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                    *)pVVar1,
                   (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                   &local_138);
        if (local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*(long *)&(local_138.
                                  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
        }
        pFVar9 = local_108;
        ((local_110->instructions).
         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_110;
        spv::Module::mapInstruction
                  (local_108->parent,
                   (local_110->instructions).
                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
        pBVar11 = (Block *)allocate_in_thread(0x78);
        IVar6 = (this->builder).uniqueId + 1;
        (this->builder).uniqueId = IVar6;
        pBVar11->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
        (pBVar11->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar11->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar11->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar11->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar11->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar11->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar11->successors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar11->successors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar11->successors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar11->localVariables).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar11->localVariables).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar11->localVariables).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pBVar11->parent = pFVar9;
        pBVar11->unreachable = false;
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
        *(undefined ***)
         &(local_138.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f31e0;
        *(Id *)(local_138.
                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 8) = IVar6;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
        *(undefined8 *)
         (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
        std::
        vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
        ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                  ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                    *)&pBVar11->instructions,
                   (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                   &local_138);
        if (local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*(long *)&(local_138.
                                  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
        }
        pFVar9 = local_108;
        ((pBVar11->instructions).
         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar11;
        spv::Module::mapInstruction
                  (local_108->parent,
                   (pBVar11->instructions).
                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
        pBVar17 = local_100;
        thenBlock = local_110;
        spv::Builder::createSelectionMerge(local_100,local_110,0);
        spv::Builder::createConditionalBranch
                  (pBVar17,(pFVar9->parameterInstructions).
                           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]->resultId,thenBlock,pBVar11)
        ;
        local_c0 = local_118;
        (this->builder).buildPoint = pBVar11;
        local_118 = pBVar11;
      }
      else {
        local_110 = (Block *)0x0;
        local_c0 = (Block *)0x0;
      }
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      pIVar12 = (Instruction *)allocate_in_thread(0x38);
      pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar12->resultId = IVar6;
      pIVar12->typeId = local_120;
      pIVar12->opCode = OpGroupNonUniformBallot;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar12->block = (Block *)0x0;
      IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,false);
      OVar7 = spv::Builder::makeIntConstant(pBVar17,IVar6,3,false);
      iVar16._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar7;
      if (iVar16._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current = OVar7;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar16._M_current + 1;
      }
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeBoolConstant(pBVar17,true,false);
      iVar16._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar16._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current =
             (Op)local_138.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar16._M_current + 1;
      }
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           allocate_in_thread(0x38);
      *(undefined ***)
       tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f31e0;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar6;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) =
           local_120;
      *(undefined4 *)
       ((long)tVar13.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 199;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 ((long)tVar13.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),
                 (iterator)0x0,(uint *)&local_138);
      iVar16._M_current =
           *(uint **)((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,local_11c);
      if (iVar16._M_current ==
          *(uint **)((long)tVar13.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   ((long)tVar13.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),
                   iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current = local_11c;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current + 1;
      }
      local_11c = *(Op *)((long)tVar13.
                                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      local_58._M_head_impl = pIVar12;
      add_instruction(this,local_118,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_58);
      pBVar17 = local_100;
      if (local_58._M_head_impl != (Instruction *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Instruction[1])();
      }
      local_58._M_head_impl = (Instruction *)0x0;
      local_60._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      add_instruction(this,local_118,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_60);
      if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
          local_60._M_t.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
        (**(code **)(*(long *)local_60._M_t.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))()
        ;
      }
      pBVar11 = local_d0;
      local_60._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
      spv::Builder::createBranch(pBVar17,local_d0);
      (this->builder).buildPoint = pBVar11;
      spv::Builder::createLoopMerge(pBVar17,local_d8,pBVar10,0);
      spv::Builder::createBranch(pBVar17,pBVar10);
      (this->builder).buildPoint = pBVar10;
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      pIVar12 = (Instruction *)allocate_in_thread(0x38);
      pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar12->resultId = IVar6;
      pIVar12->typeId = local_120;
      pIVar12->opCode = OpGroupNonUniformBroadcastFirst;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar12->block = (Block *)0x0;
      IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,false);
      OVar7 = spv::Builder::makeIntConstant(pBVar17,IVar6,3,false);
      iVar16._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar15 = (pIVar12->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8 = pBVar10;
      if (iVar16._M_current == puVar15) {
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar7;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar16,(uint *)&local_138);
        iVar16._M_current =
             (pIVar12->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar15 = (pIVar12->operands).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar16._M_current = OVar7;
        iVar16._M_current = iVar16._M_current + 1;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar16._M_current;
      }
      OVar7 = local_11c;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_11c;
      if (iVar16._M_current == puVar15) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current = local_11c;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar16._M_current + 1;
      }
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      pIVar14 = (Instruction *)allocate_in_thread(0x38);
      pIVar14->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar14->resultId = IVar6;
      pIVar14->typeId = local_c4;
      pIVar14->opCode = OpIEqual;
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar14->block = (Block *)0x0;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar7;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar14->operands,(iterator)0x0,(uint *)&local_138);
      iVar16._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
      if (iVar16._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current =
             (Op)local_138.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar16._M_current + 1;
      }
      pBVar10 = local_b8;
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           allocate_in_thread(0x38);
      *(undefined ***)
       tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f31e0;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar6;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_ec
      ;
      *(undefined4 *)
       ((long)tVar13.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0x9b;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,pIVar14->resultId);
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 ((long)tVar13.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),
                 (iterator)0x0,(uint *)&local_138);
      local_120 = *(Id *)((long)tVar13.
                                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      local_68._M_head_impl = pIVar12;
      add_instruction(this,pBVar10,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_68);
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*(local_68._M_head_impl)->_vptr_Instruction[1])();
      }
      local_68._M_head_impl = (Instruction *)0x0;
      local_70._M_head_impl = pIVar14;
      add_instruction(this,pBVar10,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_70);
      if (local_70._M_head_impl != (Instruction *)0x0) {
        (*(local_70._M_head_impl)->_vptr_Instruction[1])();
      }
      local_70._M_head_impl = (Instruction *)0x0;
      local_78._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      add_instruction(this,pBVar10,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_78);
      pBVar17 = local_100;
      if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
          local_78._M_t.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
        (**(code **)(*(long *)local_78._M_t.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))()
        ;
      }
      pBVar10 = local_e8;
      local_78._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
      spv::Builder::createSelectionMerge(pBVar17,local_e8,0);
      pBVar11 = local_e0;
      spv::Builder::createConditionalBranch(pBVar17,local_120,local_e0,pBVar10);
      (this->builder).buildPoint = pBVar11;
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           allocate_in_thread(0x38);
      *(undefined ***)
       tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f31e0;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar6;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_f0
      ;
      *(int *)((long)tVar13.
                     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                     .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
           (int)local_b0;
      pvVar2 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
      IVar6 = spv::Builder::makeIntegerType(pBVar17,0x20,false);
      OVar7 = spv::Builder::makeIntConstant(pBVar17,IVar6,3,false);
      iVar16._M_current =
           *(uint **)((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      puVar15 = *(uint **)((long)tVar13.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl +
                          0x28);
      if (iVar16._M_current == puVar15) {
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar7;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
        iVar16._M_current =
             *(uint **)((long)tVar13.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20)
        ;
        puVar15 = *(uint **)((long)tVar13.
                                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl +
                            0x28);
      }
      else {
        *iVar16._M_current = OVar7;
        iVar16._M_current = iVar16._M_current + 1;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current;
      }
      IVar6 = local_f8;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OpSourceContinued;
      if (iVar16._M_current == puVar15) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
        iVar16._M_current =
             *(uint **)((long)tVar13.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20)
        ;
        puVar15 = *(uint **)((long)tVar13.
                                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl +
                            0x28);
      }
      else {
        *iVar16._M_current = 2;
        iVar16._M_current = iVar16._M_current + 1;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current;
      }
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar6);
      if (iVar16._M_current == puVar15) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current = IVar6;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current + 1;
      }
      OVar7 = *(Op *)((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      local_80._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      add_instruction(this,local_e0,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_80);
      if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
          local_80._M_t.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
        (**(code **)(*(long *)local_80._M_t.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))()
        ;
      }
      pBVar10 = local_e8;
      local_80._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
      spv::Builder::createBranch(pBVar17,local_e8);
      (this->builder).buildPoint = pBVar10;
      IVar18 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar18;
      tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           allocate_in_thread(0x38);
      IVar6 = local_f0;
      *(undefined ***)
       tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f31e0;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar18;
      *(Id *)((long)tVar13.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_f0
      ;
      *(undefined4 *)
       ((long)tVar13.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0xf5;
      pvVar2 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
      *(long *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar7;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,(iterator)0x0,(uint *)&local_138);
      iVar16._M_current =
           *(uint **)((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      puVar15 = *(uint **)((long)tVar13.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl +
                          0x28);
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(Op *)((long)(((local_a0->
                           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                  + 8);
      if (iVar16._M_current == puVar15) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
        iVar16._M_current =
             *(uint **)((long)tVar13.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20)
        ;
        puVar15 = *(uint **)((long)tVar13.
                                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl +
                            0x28);
      }
      else {
        *iVar16._M_current =
             (Op)local_138.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar16._M_current = iVar16._M_current + 1;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current;
      }
      pBVar17 = local_100;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_f4;
      if (iVar16._M_current == puVar15) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
        iVar16._M_current =
             *(uint **)((long)tVar13.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20)
        ;
        puVar15 = *(uint **)((long)tVar13.
                                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl +
                            0x28);
      }
      else {
        *iVar16._M_current = local_f4;
        iVar16._M_current = iVar16._M_current + 1;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current;
      }
      uVar4 = *(uint *)((long)(((local_98->
                                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                       + 8);
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
      if (iVar16._M_current == puVar15) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
      }
      else {
        *iVar16._M_current = uVar4;
        *(uint **)((long)tVar13.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar16._M_current + 1;
      }
      OVar7 = *(Op *)((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      local_88._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      add_instruction(this,local_e8,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_88);
      if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
          local_88._M_t.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
        (**(code **)(*(long *)local_88._M_t.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))()
        ;
      }
      pBVar11 = local_d8;
      local_88._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
      spv::Builder::createConditionalBranch(pBVar17,local_120,local_d8,local_d0);
      pBVar10 = local_110;
      (this->builder).buildPoint = pBVar11;
      if (local_110 != (Block *)0x0) {
        spv::Builder::createBranch(pBVar17,local_110);
        (this->builder).buildPoint = pBVar10;
        IVar18 = (this->builder).uniqueId + 1;
        (this->builder).uniqueId = IVar18;
        tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
             allocate_in_thread(0x38);
        *(undefined ***)
         tVar13.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f31e0;
        *(Id *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar18;
        *(Id *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar6;
        *(Op *)((long)tVar13.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = OpPhi
        ;
        pvVar2 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 ((long)tVar13.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
        (((Vector<Id> *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0
        ;
        *(pointer *)
         ((long)tVar13.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0
        ;
        *(Block **)
         ((long)tVar13.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0
        ;
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar7;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,(iterator)0x0,(uint *)&local_138);
        iVar16._M_current =
             *(pointer *)
              ((long)tVar13.
                     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                     .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
        puVar15 = *(pointer *)
                   ((long)tVar13.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28);
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             *(Op *)((long)(((local_a8->
                             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                    + 8);
        if (iVar16._M_current == puVar15) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
          iVar16._M_current =
               *(pointer *)
                ((long)tVar13.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
          puVar15 = *(pointer *)
                     ((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28);
        }
        else {
          *iVar16._M_current =
               (Op)local_138.
                   super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar16._M_current = iVar16._M_current + 1;
          *(uint **)((long)tVar13.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
               iVar16._M_current;
        }
        pBVar17 = local_100;
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_f4;
        if (iVar16._M_current == puVar15) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
          iVar16._M_current =
               *(pointer *)
                ((long)tVar13.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
          puVar15 = *(pointer *)
                     ((long)tVar13.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28);
        }
        else {
          *iVar16._M_current = local_f4;
          iVar16._M_current = iVar16._M_current + 1;
          *(uint **)((long)tVar13.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
               iVar16._M_current;
        }
        uVar4 = *(uint *)((long)(((local_c0->instructions).
                                  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                ._M_t + 8);
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_138.
                               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
        if (iVar16._M_current == puVar15) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar16,(uint *)&local_138);
        }
        else {
          *iVar16._M_current = uVar4;
          *(uint **)((long)tVar13.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
               iVar16._M_current + 1;
        }
        OVar7 = *(Id *)((long)tVar13.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
        local_38._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
             (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
             (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
             tVar13.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
        add_instruction(this,local_110,
                        (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_38);
        if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
            local_38._M_t.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
          (**(code **)(*(long *)local_38._M_t.
                                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))
                    ();
        }
      }
      spv::Builder::makeReturn(pBVar17,false,OVar7);
      (this->builder).buildPoint = local_90;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OpCopyMemorySized;
      this_00 = &(this->builder).capabilities;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)this_00,(Capability *)&local_138);
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)this_00,(Capability *)&local_138);
      pFVar9 = local_108;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar6,(int)local_b0);
      IVar6 = (local_108->functionInstruction).resultId;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,IVar6);
      __position._M_current =
           (this->wave_multi_prefix_call_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->wave_multi_prefix_call_ids).
          super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
        ::_M_realloc_insert<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>
                  (&this->wave_multi_prefix_call_ids,__position,(MultiPrefixOp *)&local_138);
      }
      else {
        (__position._M_current)->func_id = IVar6;
        *(pointer *)__position._M_current =
             local_138.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ppMVar3 = &(this->wave_multi_prefix_call_ids).
                   super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar3 = *ppMVar3 + 1;
      }
      IVar6 = (pFVar9->functionInstruction).resultId;
      if (local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_50.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      return IVar6;
    }
    if ((pMVar8->opcode == opcode) && (pMVar8->type_id == type_id)) break;
    pMVar8 = pMVar8 + 1;
  }
  return pMVar8->func_id;
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_multi_prefix_op(SPIRVModule &module, spv::Op opcode, spv::Id type_id)
{
	for (auto &call : wave_multi_prefix_call_ids)
		if (call.opcode == opcode && call.type_id == type_id)
			return call.func_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();
	spv::Id bvec4_type = builder.makeVectorType(bool_type, 4);

	Vector<spv::Id> types = { type_id, uvec4_type };
	if (!helper_lanes_participate_in_wave_ops)
		types.push_back(bool_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       opcode_to_multi_prefix_name(opcode),
	                                       types, {}, &entry);
	spv::Id value_id = func->getParamId(0);
	spv::Id mask_id = func->getParamId(1);
	spv::Id undef_value = builder.createUndefined(type_id);

	spv::Block *outer_entry = nullptr;
	spv::Block *return_block = nullptr;
	auto *header_block = new spv::Block(builder.getUniqueId(), *func);
	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *prefix_block = new spv::Block(builder.getUniqueId(), *func);
	auto *continue_block = new spv::Block(builder.getUniqueId(), *func);

	builder.setBuildPoint(entry);

	if (!helper_lanes_participate_in_wave_ops)
	{
		return_block = new spv::Block(builder.getUniqueId(), *func);
		auto *inner_entry_block = new spv::Block(builder.getUniqueId(), *func);

		builder.createSelectionMerge(return_block, 0);
		builder.createConditionalBranch(func->getParamId(2), return_block, inner_entry_block);
		outer_entry = entry;
		entry = inner_entry_block;
		builder.setBuildPoint(entry);
	}

	{
		auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
		ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		ballot_op->addIdOperand(builder.makeBoolConstant(true));
		auto mask_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseAnd);
		mask_op->addIdOperand(ballot_op->getResultId());
		mask_op->addIdOperand(mask_id);
		mask_id = mask_op->getResultId();
		add_instruction(entry, std::move(ballot_op));
		add_instruction(entry, std::move(mask_op));
		builder.createBranch(header_block);
	}

	builder.setBuildPoint(header_block);
	{
		builder.createLoopMerge(merge_block, body_block, 0);
		builder.createBranch(body_block);
	}

	builder.setBuildPoint(body_block);
	spv::Id compare_reduce_id;
	{
		auto broadcast_first = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_first->addIdOperand(mask_id);

		auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec4_type, spv::OpIEqual);
		compare->addIdOperand(mask_id);
		compare->addIdOperand(broadcast_first->getResultId());

		auto compare_reduce = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAll);
		compare_reduce->addIdOperand(compare->getResultId());
		compare_reduce_id = compare_reduce->getResultId();

		add_instruction(body_block, std::move(broadcast_first));
		add_instruction(body_block, std::move(compare));
		add_instruction(body_block, std::move(compare_reduce));
		builder.createSelectionMerge(continue_block, 0);
		builder.createConditionalBranch(compare_reduce_id, prefix_block, continue_block);
	}

	spv::Id result_id;
	builder.setBuildPoint(prefix_block);
	{
		auto prefix_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, opcode);
		prefix_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		prefix_op->addImmediateOperand(spv::GroupOperationExclusiveScan);
		prefix_op->addIdOperand(value_id);
		result_id = prefix_op->getResultId();
		add_instruction(prefix_block, std::move(prefix_op));
		builder.createBranch(continue_block);
	}

	builder.setBuildPoint(continue_block);
	{
		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(prefix_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(body_block->getId());
		result_id = phi->getResultId();
		add_instruction(continue_block, std::move(phi));
		builder.createConditionalBranch(compare_reduce_id, merge_block, header_block);
	}

	builder.setBuildPoint(merge_block);

	if (return_block)
	{
		builder.createBranch(return_block);
		builder.setBuildPoint(return_block);

		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(merge_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(outer_entry->getId());
		result_id = phi->getResultId();
		add_instruction(return_block, std::move(phi));
	}

	builder.makeReturn(false, result_id);

	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	wave_multi_prefix_call_ids.push_back({ opcode, type_id, func->getId() });
	return func->getId();
}